

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_api.cc
# Opt level: O3

string * __thiscall
re2c::InputAPI::expr_lessthan_abi_cxx11_(string *__return_storage_ptr__,InputAPI *this,size_t n)

{
  opt_t *poVar1;
  ostream *poVar2;
  ostringstream s;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  if (this->type_ == CUSTOM) {
    poVar1 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_190,(poVar1->yylessthan)._M_dataplus._M_p,
                        (poVar1->yylessthan)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," (",2);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  }
  else if (this->type_ == DEFAULT) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"(",1);
    poVar1 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_190,(poVar1->yylimit)._M_dataplus._M_p,
                        (poVar1->yylimit)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," - ",3);
    poVar1 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(poVar1->yycursor)._M_dataplus._M_p,
                        (poVar1->yycursor)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") < ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string InputAPI::expr_lessthan (size_t n) const
{
	std::ostringstream s;
	switch (type_)
	{
		case DEFAULT:
			s << "(" << opts->yylimit << " - " << opts->yycursor << ") < " << n;
			break;
		case CUSTOM:
			s << opts->yylessthan << " (" << n << ")";
			break;
	}
	return s.str ();
}